

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

size_t bsdtar_expand_char(char *buff,size_t offset,char c)

{
  ushort **ppuVar1;
  long lVar2;
  
  ppuVar1 = __ctype_b_loc();
  lVar2 = offset + 1;
  if ((c == '\\') || (((*ppuVar1)[(byte)c] & 0x4000) == 0)) {
    buff[offset] = '\\';
    switch((int)c) {
    case 7:
      lVar2 = offset + 2;
      buff[offset + 1] = 'a';
      break;
    case 8:
      lVar2 = offset + 2;
      buff[offset + 1] = 'b';
      break;
    case 9:
      lVar2 = offset + 2;
      buff[offset + 1] = 't';
      break;
    case 10:
      lVar2 = offset + 2;
      buff[offset + 1] = 'n';
      break;
    case 0xb:
      lVar2 = offset + 2;
      buff[offset + 1] = 'v';
      break;
    case 0xc:
      lVar2 = offset + 2;
      buff[offset + 1] = 'f';
      break;
    case 0xd:
      lVar2 = offset + 2;
      buff[offset + 1] = 'r';
      break;
    default:
      if (c == 0x5c) {
        lVar2 = offset + 2;
        buff[offset + 1] = '\\';
      }
      else {
        sprintf(buff + lVar2,"%03o");
        lVar2 = offset + 4;
      }
    }
  }
  else {
    buff[offset] = c;
  }
  return lVar2 - offset;
}

Assistant:

static size_t
bsdtar_expand_char(char *buff, size_t offset, char c)
{
	size_t i = offset;

	if (isprint((unsigned char)c) && c != '\\')
		buff[i++] = c;
	else {
		buff[i++] = '\\';
		switch (c) {
		case '\a': buff[i++] = 'a'; break;
		case '\b': buff[i++] = 'b'; break;
		case '\f': buff[i++] = 'f'; break;
		case '\n': buff[i++] = 'n'; break;
#if '\r' != '\n'
		/* On some platforms, \n and \r are the same. */
		case '\r': buff[i++] = 'r'; break;
#endif
		case '\t': buff[i++] = 't'; break;
		case '\v': buff[i++] = 'v'; break;
		case '\\': buff[i++] = '\\'; break;
		default:
			sprintf(buff + i, "%03o", 0xFF & (int)c);
			i += 3;
		}
	}

	return (i - offset);
}